

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall imrt::ApertureILS::perturbation(ApertureILS *this,Plan *P)

{
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_> *plVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  ostream *poVar7;
  size_t *psVar8;
  uint uVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  _List_node_base *__node;
  _List_node_base *p_Var12;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_98;
  _List_node_base local_80;
  size_t local_70;
  double local_68;
  ApertureILS *local_60;
  Plan *local_58;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_50;
  ulong local_38;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&local_50,__x);
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
  local_58 = P;
  local_68 = Plan::getEvaluation(P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##  Perturbation: ",0x12);
  if (this->perturbation_size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"none",4);
  }
  else {
    plVar1 = &this->tabu;
    p_Var11 = (this->tabu).
              super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var11 != (_List_node_base *)plVar1) {
      p_Var12 = p_Var11->_M_next;
      operator_delete(p_Var11);
      p_Var11 = p_Var12;
    }
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  if (0 < this->perturbation_size) {
    uVar10 = 0;
    local_60 = this;
    do {
      p_Var11 = local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl
                ._M_node.super__List_node_base._M_next;
      local_38 = uVar10;
      iVar4 = rand();
      uVar10 = (ulong)(long)iVar4 %
               local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
               _M_node._M_size;
      if ((long)uVar10 < 1) {
        for (; uVar10 != 0; uVar10 = uVar10 + 1) {
          p_Var11 = p_Var11->_M_prev;
        }
      }
      else {
        do {
          p_Var11 = p_Var11->_M_next;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      iVar4 = rand();
      if ((double)iVar4 / 2147483647.0 <= 0.3) {
        do {
          iVar4 = rand();
          iVar5 = Collimator::getNangleBeamlets
                            ((Collimator *)p_Var11[1]._M_next[0xb]._M_next,
                             *(int *)&(p_Var11[1]._M_next)->_M_prev);
          iVar4 = iVar4 % iVar5;
          bVar3 = Station::isActiveBeamlet((Station *)p_Var11[1]._M_next,iVar4);
        } while (!bVar3);
        iVar5 = rand();
        iVar5 = iVar5 % ((Station *)p_Var11[1]._M_next)->max_apertures;
        bVar3 = Station::isOpenBeamlet((Station *)p_Var11[1]._M_next,iVar4,iVar5);
        if (bVar3) {
          iVar6 = rand();
          if ((double)iVar6 / 2147483647.0 <= 0.5) {
            Station::closeBeamlet_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_80,(Station *)p_Var11[1]._M_next,iVar4,iVar5,true);
            p_Var12 = local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            if (local_98.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
              do {
                p_Var2 = p_Var12->_M_next;
                operator_delete(p_Var12);
                p_Var12 = p_Var2;
              } while (p_Var2 != (_List_node_base *)&local_98);
            }
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size = 0;
            if (local_80._M_next == &local_80) {
              psVar8 = &local_98.
                        super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl._M_node._M_size;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
            }
            else {
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next = local_80._M_next;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_prev = local_80._M_prev;
              (local_80._M_prev)->_M_next = (_List_node_base *)&local_98;
              (local_80._M_next)->_M_prev = (_List_node_base *)&local_98;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node._M_size = local_70;
              psVar8 = &local_70;
              local_80._M_next = &local_80;
              local_80._M_prev = &local_80;
            }
            *psVar8 = 0;
            p_Var12 = local_80._M_next;
            while (p_Var12 != &local_80) {
              p_Var2 = p_Var12->_M_next;
              operator_delete(p_Var12);
              p_Var12 = p_Var2;
            }
          }
          else {
            Station::closeBeamlet_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_80,(Station *)p_Var11[1]._M_next,iVar4,iVar5,false);
            p_Var12 = local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            if (local_98.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
              do {
                p_Var2 = p_Var12->_M_next;
                operator_delete(p_Var12);
                p_Var12 = p_Var2;
              } while (p_Var2 != (_List_node_base *)&local_98);
            }
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size = 0;
            if (local_80._M_next == &local_80) {
              psVar8 = &local_98.
                        super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl._M_node._M_size;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
            }
            else {
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next = local_80._M_next;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_prev = local_80._M_prev;
              (local_80._M_prev)->_M_next = (_List_node_base *)&local_98;
              (local_80._M_next)->_M_prev = (_List_node_base *)&local_98;
              local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node._M_size = local_70;
              psVar8 = &local_70;
              local_80._M_next = &local_80;
              local_80._M_prev = &local_80;
            }
            *psVar8 = 0;
            p_Var12 = local_80._M_next;
            while (p_Var12 != &local_80) {
              p_Var2 = p_Var12->_M_next;
              operator_delete(p_Var12);
              p_Var12 = p_Var2;
            }
          }
        }
        else {
          Station::openBeamlet_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_80,(Station *)p_Var11[1]._M_next,iVar4,iVar5);
          p_Var12 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var12->_M_next;
              operator_delete(p_Var12);
              p_Var12 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size = 0;
          if (local_80._M_next == &local_80) {
            psVar8 = &local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node._M_size;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
          }
          else {
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = local_80._M_next;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = local_80._M_prev;
            (local_80._M_prev)->_M_next = (_List_node_base *)&local_98;
            (local_80._M_next)->_M_prev = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size = local_70;
            psVar8 = &local_70;
            local_80._M_next = &local_80;
            local_80._M_prev = &local_80;
          }
          *psVar8 = 0;
          p_Var12 = local_80._M_next;
          while (p_Var12 != &local_80) {
            p_Var2 = p_Var12->_M_next;
            operator_delete(p_Var12);
            p_Var12 = p_Var2;
          }
        }
        local_68 = Plan::incremental_eval(local_58,(Station *)p_Var11[1]._M_next,&local_98);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)&(p_Var11[1]._M_next)->_M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
      }
      else {
        iVar4 = rand();
        iVar4 = iVar4 % *(int *)&p_Var11[1]._M_next[4]._M_next;
        iVar5 = rand();
        if ((double)iVar5 / 2147483647.0 <= 0.5) {
          Station::modifyIntensityAperture_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_80,(Station *)p_Var11[1]._M_next,iVar4,(double)local_60->step_intensity)
          ;
          p_Var12 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var12->_M_next;
              operator_delete(p_Var12);
              p_Var12 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size = 0;
          if (local_80._M_next == &local_80) {
            psVar8 = &local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node._M_size;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
          }
          else {
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = local_80._M_next;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = local_80._M_prev;
            (local_80._M_prev)->_M_next = (_List_node_base *)&local_98;
            (local_80._M_next)->_M_prev = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size = local_70;
            psVar8 = &local_70;
            local_80._M_next = &local_80;
            local_80._M_prev = &local_80;
          }
          *psVar8 = 0;
          p_Var12 = local_80._M_next;
          while (p_Var12 != &local_80) {
            p_Var2 = p_Var12->_M_next;
            operator_delete(p_Var12);
            p_Var12 = p_Var2;
          }
        }
        else {
          Station::modifyIntensityAperture_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_80,(Station *)p_Var11[1]._M_next,iVar4,(double)-local_60->step_intensity
                    );
          p_Var12 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var12->_M_next;
              operator_delete(p_Var12);
              p_Var12 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size = 0;
          if (local_80._M_next == &local_80) {
            psVar8 = &local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node._M_size;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
          }
          else {
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next = local_80._M_next;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev = local_80._M_prev;
            (local_80._M_prev)->_M_next = (_List_node_base *)&local_98;
            (local_80._M_next)->_M_prev = (_List_node_base *)&local_98;
            local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size = local_70;
            psVar8 = &local_70;
            local_80._M_next = &local_80;
            local_80._M_prev = &local_80;
          }
          *psVar8 = 0;
          p_Var12 = local_80._M_next;
          while (p_Var12 != &local_80) {
            p_Var2 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            operator_delete(p_Var12);
            p_Var12 = p_Var2;
          }
        }
        local_68 = Plan::incremental_eval(local_58,(Station *)p_Var11[1]._M_next,&local_98);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)&(p_Var11[1]._M_next)->_M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
      }
      Station::clearHistory((Station *)p_Var11[1]._M_next);
      uVar9 = (int)local_38 + 1;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < local_60->perturbation_size);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", new eval: ",0xc);
  poVar7 = std::ostream::_M_insert<double>(local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  p_Var11 = local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
    do {
      p_Var12 = p_Var11->_M_next;
      operator_delete(p_Var11);
      p_Var11 = p_Var12;
    } while (p_Var12 != (_List_node_base *)&local_98);
  }
  while (local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_50) {
    p_Var11 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_50.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var11;
  }
  return local_68;
}

Assistant:

double ApertureILS::perturbation(Plan& P) {
  list<Station*> stations = P.get_stations();
  int beamlet, aperture;
  list<pair<int,double>> diff;
  double aux_eval=P.getEvaluation();
  
  cout << "##  Perturbation: " ;
  if (perturbation_size==0) cout << "none";   
  else tabu.clear();
  for (int i=0; i<perturbation_size; i++) {
    list<Station*>::iterator s=stations.begin();
    std::advance(s,rand()%stations.size());
    if (((double) rand() / (RAND_MAX)) > 0.3) {
      //Modify intensity
      aperture = (rand()% (*s)->getNbApertures());
      if (((double) rand() / (RAND_MAX)) > 0.5){ 
        diff = (*s)->modifyIntensityAperture(aperture, -step_intensity);
      }else{ 
        diff = (*s)->modifyIntensityAperture(aperture, step_intensity);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << ","<< aperture<<") ";
    } else {
      //Modify aperture
      do { 
        beamlet = (rand()% (*s)->getNbBeamlets());
      } while (!(*s)->isActiveBeamlet(beamlet));
      aperture = (rand()% (*s)->getNbApertures());
      if ((*s)->isOpenBeamlet(beamlet, aperture)){
        if (((double) rand() / (RAND_MAX)) > 0.5) 
          diff = (*s)->closeBeamlet(beamlet, aperture, false);
        else
          diff = (*s)->closeBeamlet(beamlet, aperture, true);
      } else {
        diff = (*s)->openBeamlet(beamlet, aperture);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << "," << aperture<< "," << beamlet << ") ";
    }
    (*s)->clearHistory();
  }
  
  //aux_eval = P.eval();
  cout << ", new eval: "<< aux_eval<< endl;
  return(aux_eval);
}